

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionRequest::~DecodeRawTransactionRequest
          (DecodeRawTransactionRequest *this)

{
  DecodeRawTransactionRequest *in_RDI;
  
  ~DecodeRawTransactionRequest(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~DecodeRawTransactionRequest() {
    // do nothing
  }